

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_start_map(Parser *this,bool as_child)

{
  pfn_error p_Var1;
  size_t sVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  csubstr tag;
  csubstr tag_00;
  csubstr tag_01;
  csubstr tag_02;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  csubstr key_00;
  bool bVar6;
  error_flags eVar7;
  NodeData *pNVar8;
  NodeData *pNVar9;
  size_t sVar10;
  byte in_SIL;
  Parser *in_RDI;
  State *parent_state;
  type_bits as_doc;
  char msg_3 [34];
  csubstr key;
  type_bits key_quoted;
  char msg_2 [77];
  char msg_1 [34];
  size_t parent_id;
  char msg [58];
  size_t child;
  flag_t in_stack_fffffffffffffae8;
  flag_t in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  Tree *in_stack_fffffffffffffb08;
  Location *in_stack_fffffffffffffb10;
  Parser *in_stack_fffffffffffffb38;
  Tree *in_stack_fffffffffffffb40;
  Tree *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  char *in_stack_fffffffffffffb58;
  pfn_error in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  char *pcVar11;
  size_t in_stack_fffffffffffffb70;
  undefined1 *in_stack_fffffffffffffba8;
  Parser *in_stack_fffffffffffffbb0;
  size_t local_428;
  Parser *this_00;
  Parser *pPVar12;
  size_t in_stack_fffffffffffffc08;
  Tree *in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc18 [16];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  type_bits in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  Tree *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc60;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  Tree *local_380;
  char local_378 [48];
  char *local_348;
  Tree *in_stack_fffffffffffffcc0;
  flag_t local_300;
  flag_t fStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  Tree *local_2e0;
  undefined1 local_2d8 [88];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  Tree *local_260;
  char local_258 [48];
  size_t local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  Tree *local_200;
  char local_1f8 [71];
  byte local_1b1;
  csubstr *local_1a8;
  csubstr *local_1a0;
  size_t local_198;
  Tree *local_190;
  size_t local_188;
  Tree *local_180;
  NodeData *local_178;
  csubstr *local_170;
  size_t local_168;
  Tree *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Tree *local_138;
  stack<c4::yml::Parser::State,_16UL> *local_130;
  undefined8 local_128;
  flag_t fStack_124;
  undefined8 uStack_120;
  long local_100;
  stack<c4::yml::Parser::State,_16UL> *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  Tree *local_d0;
  long local_c8;
  stack<c4::yml::Parser::State,_16UL> *local_c0;
  size_t local_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_60;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  Tree *in_stack_ffffffffffffffc0;
  
  local_1b1 = in_SIL & 1;
  addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               in_stack_fffffffffffffaec,in_stack_fffffffffffffae8);
  this_00 = (Parser *)&in_RDI->m_stack;
  local_130 = (stack<c4::yml::Parser::State,_16UL> *)this_00;
  if ((in_RDI->m_stack).m_size == 0) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    in_stack_fffffffffffffaf8 = (undefined4)local_148;
    in_stack_fffffffffffffafc = (undefined4)((ulong)local_148 >> 0x20);
    in_stack_fffffffffffffb00 = (undefined4)uStack_140;
    in_stack_fffffffffffffb04 = (undefined4)((ulong)uStack_140 >> 0x20);
    in_stack_fffffffffffffae8 = (flag_t)local_158;
    in_stack_fffffffffffffaec = (flag_t)((ulong)local_158 >> 0x20);
    in_stack_fffffffffffffaf0 = (undefined4)uStack_150;
    in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_150 >> 0x20);
    loc.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
    loc.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
    loc.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
    loc.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
    loc.name.str = (char *)in_stack_fffffffffffffb68;
    loc.name.len = in_stack_fffffffffffffb70;
    error<25ul>((char (*) [25])in_stack_fffffffffffffb40,loc);
    in_stack_fffffffffffffb08 = local_138;
  }
  pNVar8 = node((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                (State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  pNVar9 = node((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  if (pNVar8 != pNVar9) {
    memcpy(local_1f8,"check failed: (node(m_stack.bottom()) == node(m_root_id))",0x3a);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    in_stack_fffffffffffffaf8 = (undefined4)local_210;
    in_stack_fffffffffffffafc = (undefined4)((ulong)local_210 >> 0x20);
    in_stack_fffffffffffffb00 = (undefined4)uStack_208;
    in_stack_fffffffffffffb04 = (undefined4)((ulong)uStack_208 >> 0x20);
    in_stack_fffffffffffffae8 = (flag_t)local_220;
    in_stack_fffffffffffffaec = (flag_t)((ulong)local_220 >> 0x20);
    in_stack_fffffffffffffaf0 = (undefined4)uStack_218;
    in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_218 >> 0x20);
    LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffffaf0;
    LVar3.super_LineCol.offset = local_220;
    LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffffaf4;
    LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffffaf8;
    LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffffafc;
    LVar3.name.str._0_4_ = in_stack_fffffffffffffb00;
    LVar3.name.str._4_4_ = in_stack_fffffffffffffb04;
    LVar3.name.len = (size_t)local_200;
    (*p_Var1)(local_1f8,0x3a,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffb08 = local_200;
  }
  sVar10 = detail::stack<c4::yml::Parser::State,_16UL>::size(&in_RDI->m_stack);
  pPVar12 = in_RDI;
  if (sVar10 < 2) {
    local_428 = in_RDI->m_root_id;
  }
  else {
    local_c0 = &in_RDI->m_stack;
    local_c8 = 1;
    if ((in_RDI->m_stack).m_size < 2) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      in_stack_fffffffffffffaf8 = (undefined4)local_e0;
      in_stack_fffffffffffffafc = (undefined4)((ulong)local_e0 >> 0x20);
      in_stack_fffffffffffffb00 = (undefined4)uStack_d8;
      in_stack_fffffffffffffb04 = (undefined4)((ulong)uStack_d8 >> 0x20);
      in_stack_fffffffffffffae8 = (flag_t)local_f0;
      in_stack_fffffffffffffaec = (flag_t)((ulong)local_f0 >> 0x20);
      in_stack_fffffffffffffaf0 = (undefined4)uStack_e8;
      in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_e8 >> 0x20);
      loc_00.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
      loc_00.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
      loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
      loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
      loc_00.name.str = (char *)in_stack_fffffffffffffb68;
      loc_00.name.len = in_stack_fffffffffffffb70;
      error<25ul>((char (*) [25])in_stack_fffffffffffffb40,loc_00);
      in_stack_fffffffffffffb08 = local_d0;
    }
    local_428 = (in_RDI->m_stack).m_stack[((in_RDI->m_stack).m_size - 1) - local_c8].node_id;
  }
  local_228 = local_428;
  if (local_428 == 0xffffffffffffffff) {
    memcpy(local_258,"check failed: (parent_id != NONE)",0x22);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var1 = (pPVar12->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    in_stack_fffffffffffffaf8 = (undefined4)local_270;
    in_stack_fffffffffffffafc = (undefined4)((ulong)local_270 >> 0x20);
    in_stack_fffffffffffffb00 = (undefined4)uStack_268;
    in_stack_fffffffffffffb04 = (undefined4)((ulong)uStack_268 >> 0x20);
    in_stack_fffffffffffffae8 = (flag_t)local_280;
    in_stack_fffffffffffffaec = (flag_t)((ulong)local_280 >> 0x20);
    in_stack_fffffffffffffaf0 = (undefined4)uStack_278;
    in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_278 >> 0x20);
    LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffffaf0;
    LVar4.super_LineCol.offset = local_280;
    LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffffaf4;
    LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffffaf8;
    LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffffafc;
    LVar4.name.str._0_4_ = in_stack_fffffffffffffb00;
    LVar4.name.str._4_4_ = in_stack_fffffffffffffb04;
    LVar4.name.len = (size_t)local_260;
    (*p_Var1)(local_258,0x22,LVar4,(pPVar12->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffb08 = local_260;
  }
  pNVar8 = node((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                (State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  if (pNVar8 != (NodeData *)0x0) {
    pNVar8 = node((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                  (State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    pNVar9 = node((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    if (pNVar8 != pNVar9) {
      memcpy(local_2d8,
             "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))",0x4d);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      in_stack_fffffffffffffbb0 = (Parser *)(pPVar12->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffffba8 = local_2d8;
      Location::Location(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      (*(code *)in_stack_fffffffffffffbb0)
                (in_stack_fffffffffffffba8,0x4d,(pPVar12->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffae8 = local_300;
      in_stack_fffffffffffffaec = fStack_2fc;
      in_stack_fffffffffffffaf0 = uStack_2f8;
      in_stack_fffffffffffffaf4 = uStack_2f4;
      in_stack_fffffffffffffaf8 = local_2f0;
      in_stack_fffffffffffffafc = uStack_2ec;
      in_stack_fffffffffffffb00 = uStack_2e8;
      in_stack_fffffffffffffb04 = uStack_2e4;
      in_stack_fffffffffffffb08 = local_2e0;
    }
  }
  sVar10 = local_228;
  if ((local_1b1 & 1) == 0) {
    if (local_228 == 0xffffffffffffffff) {
      memcpy(local_378,"check failed: (parent_id != NONE)",0x22);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      in_stack_fffffffffffffb60 = (pPVar12->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffffb58 = local_378;
      Location::Location(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      in_stack_fffffffffffffaf8 = (undefined4)local_390;
      in_stack_fffffffffffffafc = (undefined4)((ulong)local_390 >> 0x20);
      in_stack_fffffffffffffb00 = (undefined4)uStack_388;
      in_stack_fffffffffffffb04 = (undefined4)((ulong)uStack_388 >> 0x20);
      in_stack_fffffffffffffae8 = (flag_t)in_stack_fffffffffffffc60;
      in_stack_fffffffffffffaec = (flag_t)(in_stack_fffffffffffffc60 >> 0x20);
      in_stack_fffffffffffffaf0 = (undefined4)uStack_398;
      in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_398 >> 0x20);
      LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffffaf0;
      LVar5.super_LineCol.offset = in_stack_fffffffffffffc60;
      LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffffaf4;
      LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffffaf8;
      LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffffafc;
      LVar5.name.str._0_4_ = in_stack_fffffffffffffb00;
      LVar5.name.str._4_4_ = in_stack_fffffffffffffb04;
      LVar5.name.len = (size_t)local_380;
      (*in_stack_fffffffffffffb60)
                (in_stack_fffffffffffffb58,0x22,LVar5,(pPVar12->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffb08 = local_380;
    }
    pPVar12->m_state->node_id = local_228;
    local_160 = pPVar12->m_tree;
    local_168 = pPVar12->m_state->node_id;
    Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    local_180 = pPVar12->m_tree;
    local_188 = local_228;
    local_178 = Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    if (((local_178->m_type).type & MAP) == NOTYPE) {
      bVar6 = Tree::has_children((Tree *)CONCAT44(in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0),
                                 CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      if (bVar6) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)
                           ,(char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                           CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        in_stack_fffffffffffffaf8 = (undefined4)in_stack_fffffffffffffc40;
        in_stack_fffffffffffffafc = (undefined4)(in_stack_fffffffffffffc40 >> 0x20);
        in_stack_fffffffffffffb00 = (undefined4)in_stack_fffffffffffffc48;
        in_stack_fffffffffffffb04 = (undefined4)(in_stack_fffffffffffffc48 >> 0x20);
        in_stack_fffffffffffffae8 = (flag_t)local_3d0;
        in_stack_fffffffffffffaec = (flag_t)((ulong)local_3d0 >> 0x20);
        in_stack_fffffffffffffaf0 = (undefined4)uStack_3c8;
        in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_3c8 >> 0x20);
        loc_04.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
        loc_04.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
        loc_04.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
        loc_04.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
        loc_04.name.str = (char *)in_stack_fffffffffffffb68;
        loc_04.name.len = in_stack_fffffffffffffb70;
        error<47ul>((char (*) [47])in_stack_fffffffffffffb40,loc_04);
      }
      Tree::to_map(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(type_bits)pPVar12);
    }
    else {
      Tree::_add_flags(in_stack_fffffffffffffb08,
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    }
    _move_scalar_from_top(this_00);
    in_stack_fffffffffffffb48 = (Tree *)&pPVar12->m_key_anchor;
    in_stack_fffffffffffffb57 = false;
    if ((pPVar12->m_key_anchor).len != 0) {
      in_stack_fffffffffffffb57 = ((csubstr *)in_stack_fffffffffffffb48)->str != (char *)0x0;
    }
    if ((bool)in_stack_fffffffffffffb57 != false) {
      pPVar12->m_key_anchor_was_before = true;
    }
    local_170 = (csubstr *)in_stack_fffffffffffffb48;
    _write_val_anchor(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
    sVar10 = detail::stack<c4::yml::Parser::State,_16UL>::size(&pPVar12->m_stack);
    if (1 < sVar10) {
      in_stack_fffffffffffffb40 = (Tree *)&pPVar12->m_stack;
      local_100 = 1;
      local_f8 = (stack<c4::yml::Parser::State,_16UL> *)in_stack_fffffffffffffb40;
      if ((pPVar12->m_stack).m_size < 2) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)
                           ,(char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                           CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        in_stack_fffffffffffffaf0 = (undefined4)uStack_120;
        in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_120 >> 0x20);
        loc_05.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
        loc_05.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
        loc_05.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
        loc_05.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
        loc_05.name.str = (char *)in_stack_fffffffffffffb68;
        loc_05.name.len = in_stack_fffffffffffffb70;
        error<25ul>((char (*) [25])in_stack_fffffffffffffb40,loc_05);
        in_stack_fffffffffffffaec = fStack_124;
      }
      if ((*(uint *)(in_stack_fffffffffffffb40[9].m_tag_directives[0].next_node_id +
                    (long)(in_stack_fffffffffffffb40[9].m_tag_directives[1].handle.str +
                          (-1 - local_100)) * 0x98) & 0x800) != 0) {
        add_flags((Parser *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                  in_stack_fffffffffffffaec);
      }
    }
    in_stack_fffffffffffffb38 = (Parser *)(pPVar12->m_state->line_contents).rem.str;
    pNVar8 = Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    (pNVar8->m_val).scalar.str = (char *)in_stack_fffffffffffffb38;
  }
  else {
    local_190 = pPVar12->m_tree;
    local_198 = local_228;
    pNVar8 = Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    sVar2 = pNVar8->m_last_child;
    if (sVar10 == 0xffffffffffffffff) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      in_stack_fffffffffffffaf8 = (undefined4)in_stack_ffffffffffffffb0;
      in_stack_fffffffffffffafc = (undefined4)(in_stack_ffffffffffffffb0 >> 0x20);
      in_stack_fffffffffffffb00 = (undefined4)in_stack_ffffffffffffffb8;
      in_stack_fffffffffffffb04 = (undefined4)(in_stack_ffffffffffffffb8 >> 0x20);
      in_stack_fffffffffffffae8 = (flag_t)local_60;
      in_stack_fffffffffffffaec = (flag_t)((ulong)local_60 >> 0x20);
      in_stack_fffffffffffffaf0 = (undefined4)in_stack_ffffffffffffffa8;
      in_stack_fffffffffffffaf4 = (undefined4)(in_stack_ffffffffffffffa8 >> 0x20);
      loc_01.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
      loc_01.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
      loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
      loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
      loc_01.name.str = (char *)in_stack_fffffffffffffb68;
      loc_01.name.len = in_stack_fffffffffffffb70;
      error<29ul>((char (*) [29])in_stack_fffffffffffffb40,loc_01);
    }
    pNVar8 = Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    if ((((pNVar8->m_type).type & (STREAM|MAP)) == NOTYPE) &&
       (bVar6 = Tree::is_root(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38), !bVar6))
    {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      in_stack_fffffffffffffaf8 = (undefined4)local_78;
      in_stack_fffffffffffffafc = (undefined4)((ulong)local_78 >> 0x20);
      in_stack_fffffffffffffb00 = (undefined4)uStack_70;
      in_stack_fffffffffffffb04 = (undefined4)((ulong)uStack_70 >> 0x20);
      in_stack_fffffffffffffae8 = (flag_t)local_88;
      in_stack_fffffffffffffaec = (flag_t)((ulong)local_88 >> 0x20);
      in_stack_fffffffffffffaf0 = (undefined4)uStack_80;
      in_stack_fffffffffffffaf4 = (undefined4)((ulong)uStack_80 >> 0x20);
      loc_02.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
      loc_02.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
      loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
      loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
      loc_02.name.str = (char *)in_stack_fffffffffffffb68;
      loc_02.name.len = in_stack_fffffffffffffb70;
      error<54ul>((char (*) [54])in_stack_fffffffffffffb40,loc_02);
    }
    if ((sVar2 != 0xffffffffffffffff) &&
       (pNVar8 = Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38),
       pNVar8->m_parent != sVar10)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      Location::Location((Location *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      loc_03.super_LineCol.offset._7_1_ = in_stack_fffffffffffffb57;
      loc_03.super_LineCol.offset._0_7_ = in_stack_fffffffffffffb50;
      loc_03.super_LineCol.line = (size_t)in_stack_fffffffffffffb58;
      loc_03.super_LineCol.col = (size_t)in_stack_fffffffffffffb60;
      loc_03.name.str = (char *)in_stack_fffffffffffffb68;
      loc_03.name.len = in_stack_fffffffffffffb70;
      error<63ul>((char (*) [63])in_stack_fffffffffffffb40,loc_03);
    }
    local_b8 = Tree::_claim(in_stack_fffffffffffffcc0);
    Tree::_set_hierarchy
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    pPVar12->m_state->node_id = local_b8;
    bVar6 = has_all(pPVar12,0x200);
    if (bVar6) {
      _consume_scalar(in_stack_fffffffffffffb38);
      key_00.len = in_stack_fffffffffffffc60;
      key_00.str = in_stack_fffffffffffffc58;
      Tree::to_map(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,key_00,
                   in_stack_fffffffffffffc40);
      _write_key_anchor(in_stack_fffffffffffffc18._8_8_,in_stack_fffffffffffffc18._0_8_);
      local_1a0 = &pPVar12->m_key_tag;
      bVar6 = true;
      if ((pPVar12->m_key_tag).len != 0) {
        bVar6 = local_1a0->str == (char *)0x0;
      }
      if (!bVar6) {
        local_348 = (pPVar12->m_key_tag).str;
        tag.len = (size_t)in_stack_fffffffffffffb40;
        tag.str = (char *)in_stack_fffffffffffffb38;
        normalize_tag(tag);
        tag_02.str._7_1_ = in_stack_fffffffffffffb57;
        tag_02.str._0_7_ = in_stack_fffffffffffffb50;
        tag_02.len = (size_t)in_stack_fffffffffffffb58;
        Tree::set_key_tag(in_stack_fffffffffffffb48,(size_t)in_stack_fffffffffffffb40,tag_02);
        basic_substring<const_char>::clear(&pPVar12->m_key_tag);
      }
    }
    else {
      Tree::to_map(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(type_bits)pPVar12);
    }
    pcVar11 = (pPVar12->m_state->line_contents).rem.str;
    pNVar8 = Tree::_p(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    (pNVar8->m_val).scalar.str = pcVar11;
    _write_val_anchor(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
  }
  local_1a8 = &pPVar12->m_val_tag;
  bVar6 = true;
  if ((pPVar12->m_val_tag).len != 0) {
    bVar6 = local_1a8->str == (char *)0x0;
  }
  if (!bVar6) {
    tag_00.len = (size_t)in_stack_fffffffffffffb40;
    tag_00.str = (char *)in_stack_fffffffffffffb38;
    normalize_tag(tag_00);
    tag_01.len._0_7_ = in_stack_fffffffffffffb50;
    tag_01.str = (char *)in_stack_fffffffffffffb48;
    tag_01.len._7_1_ = in_stack_fffffffffffffb57;
    Tree::set_val_tag(in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38,tag_01);
    basic_substring<const_char>::clear(&pPVar12->m_val_tag);
  }
  return;
}

Assistant:

void Parser::_start_map(bool as_child)
{
    _c4dbgpf("start_map (as child={})", as_child);
    addrem_flags(RMAP|RVAL, RKEY|RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            type_bits key_quoted = NOTYPE;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_map(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_map: id={} key='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            m_tree->to_map(m_state->node_id);
            _c4dbgpf("start_map: id={}", m_state->node_id);
        }
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
        _write_val_anchor(m_state->node_id);
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
        m_state->node_id = parent_id;
        _c4dbgpf("start_map: id={}", m_state->node_id);
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_map(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_map(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        if(m_key_anchor.not_empty())
            m_key_anchor_was_before = true;
        _write_val_anchor(parent_id);
        if(m_stack.size() >= 2)
        {
            State const& parent_state = m_stack.top(1);
            if(parent_state.flags & RSET)
                add_flags(RSET);
        }
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}